

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.cpp
# Opt level: O1

shared_ptr<SL::WS_LITE::IWSListener_Configuration> __thiscall
SL::WS_LITE::HubContext_Configuration::CreateListener
          (HubContext_Configuration *this,PortNumber port,NetworkProtocol protocol,
          ExtensionOptions options)

{
  long *plVar1;
  shared_ptr<SL::WS_LITE::ThreadContext> *t;
  basic_socket_acceptor<asio::ip::tcp> *this_00;
  long *plVar2;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined6 in_register_00000032;
  long lVar3;
  undefined1 in_R8B;
  shared_ptr<SL::WS_LITE::IWSListener_Configuration> sVar4;
  undefined1 local_68 [40];
  __atomic_base<unsigned_long> local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  __uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  local_30;
  
  lVar3 = CONCAT62(in_register_00000032,port.value);
  local_68._2_2_ = (ushort)protocol << 8 | (ushort)protocol >> 8;
  if ((int)CONCAT71(in_register_00000009,options) == 0) {
    HubContext::getnextContext((HubContext *)&local_40);
    local_68._8_4_ = 0;
    local_68._12_4_ = 0;
    local_68._16_4_ = 0;
    local_68._20_8_ = 0;
    local_68._0_2_ = 2;
    local_68._4_4_ = 0;
    this_00 = (basic_socket_acceptor<asio::ip::tcp> *)operator_new(0x20);
    asio::basic_socket_acceptor<asio::ip::tcp>::basic_socket_acceptor
              (this_00,(io_context *)(local_40._M_i + 8),(endpoint_type *)local_68,true);
  }
  else {
    HubContext::getnextContext((HubContext *)&local_40);
    local_68._0_2_ = 10;
    local_68._4_4_ = 0;
    local_68._8_4_ = 0;
    local_68._12_4_ = 0;
    local_68._16_4_ = 0;
    local_68._20_8_ = 0;
    this_00 = (basic_socket_acceptor<asio::ip::tcp> *)operator_new(0x20);
    asio::basic_socket_acceptor<asio::ip::tcp>::basic_socket_acceptor
              (this_00,(io_context *)(local_40._M_i + 8),(endpoint_type *)local_68,true);
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  .super__Head_base<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_false>._M_head_impl =
       (tuple<asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
        )(_Tuple_impl<0UL,_asio::basic_socket_acceptor<asio::ip::tcp>_*,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
          )0x0;
  std::
  __uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  ::reset((__uniq_ptr_impl<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
           *)(*(long *)(lVar3 + 8) + 0x20),this_00);
  std::
  unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
  ::~unique_ptr((unique_ptr<asio::basic_socket_acceptor<asio::ip::tcp>,_std::default_delete<asio::basic_socket_acceptor<asio::ip::tcp>_>_>
                 *)&local_30);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  plVar1 = *(long **)(*(long *)(lVar3 + 8) + 0x10);
  for (plVar2 = *(long **)(*(long *)(lVar3 + 8) + 8); plVar2 != plVar1; plVar2 = plVar2 + 2) {
    *(undefined1 *)(*(long *)(*plVar2 + 0x38) + 0x140) = in_R8B;
  }
  local_68._0_2_ = 0;
  local_68._2_2_ = 0;
  local_68._4_4_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<SL::WS_LITE::WSListener_Configuration,std::allocator<SL::WS_LITE::WSListener_Configuration>,std::shared_ptr<SL::WS_LITE::HubContext>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8),
             (WSListener_Configuration **)local_68,
             (allocator<SL::WS_LITE::WSListener_Configuration> *)&local_40,
             (shared_ptr<SL::WS_LITE::HubContext> *)(lVar3 + 8));
  (this->super_IWSContext_Configuration)._vptr_IWSContext_Configuration =
       (_func_int **)CONCAT44(local_68._4_4_,CONCAT22(local_68._2_2_,local_68._0_2_));
  (this->HubContext_).super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->HubContext_).super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)CONCAT44(local_68._12_4_,local_68._8_4_);
  sVar4.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<SL::WS_LITE::IWSListener_Configuration>)
         sVar4.
         super___shared_ptr<SL::WS_LITE::IWSListener_Configuration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<IWSListener_Configuration> CreateListener(PortNumber port, NetworkProtocol protocol,
                                                                          ExtensionOptions options) override
        {
            if (protocol == NetworkProtocol::IPV4) {
                HubContext_->acceptor = std::make_unique<asio::ip::tcp::acceptor>(HubContext_->getnextContext()->io_service,
                                                                                  asio::ip::tcp::endpoint(asio::ip::tcp::v4(), port.value));
            }
            else {
                HubContext_->acceptor = std::make_unique<asio::ip::tcp::acceptor>(HubContext_->getnextContext()->io_service,
                                                                                  asio::ip::tcp::endpoint(asio::ip::tcp::v6(), port.value));
            }
            for (auto &t : HubContext_->ThreadContexts) {
                t->WebSocketContext_->ExtensionOptions_ = options;
            }
            return std::make_shared<WSListener_Configuration>(HubContext_);
        }